

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_iterate(roaring_bitmap_t *r,roaring_iterator iterator,void *ptr)

{
  _Bool _Var1;
  undefined8 in_RAX;
  array_container_t *cont;
  uint32_t base;
  long lVar2;
  long lVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (lVar3 = 0; lVar2 = (long)(r->high_low_container).size, lVar3 < lVar2; lVar3 = lVar3 + 1) {
    base = (uint)(r->high_low_container).keys[lVar3] << 0x10;
    uStack_38 = CONCAT17((r->high_low_container).typecodes[lVar3],(undefined7)uStack_38);
    cont = (array_container_t *)
           container_unwrap_shared
                     ((r->high_low_container).containers[lVar3],(uint8_t *)((long)&uStack_38 + 7));
    if (uStack_38._7_1_ == '\x01') {
      _Var1 = bitset_container_iterate((bitset_container_t *)cont,base,iterator,ptr);
    }
    else if (uStack_38._7_1_ == '\x03') {
      _Var1 = run_container_iterate((run_container_t *)cont,base,iterator,ptr);
    }
    else {
      if (uStack_38._7_1_ != '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x17e9,
                      "_Bool container_iterate(const container_t *, uint8_t, uint32_t, roaring_iterator, void *)"
                     );
      }
      _Var1 = array_container_iterate(cont,base,iterator,ptr);
    }
    if (_Var1 == false) break;
  }
  return lVar2 <= lVar3;
}

Assistant:

bool roaring_iterate(const roaring_bitmap_t *r, roaring_iterator iterator,
                     void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate(ra->containers[i], ra->typecodes[i],
                               ((uint32_t)ra->keys[i]) << 16,
                               iterator, ptr)) {
            return false;
        }
    return true;
}